

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::SwiftGenerator
          (SwiftGenerator *this,Parser *parser,string *path,string *file_name)

{
  IdlNamer *this_00;
  SwiftGenerator *pSVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_dc9;
  allocator<char> local_dc8;
  allocator<char> local_dc7;
  allocator<char> local_dc6;
  allocator<char> local_dc5;
  allocator<char> local_dc4;
  allocator<char> local_dc3;
  allocator<char> local_dc2;
  allocator_type local_dc1;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_dc0;
  allocator<char> local_dbf;
  allocator<char> local_dbe;
  allocator<char> local_dbd;
  allocator<char> local_dbc;
  allocator<char> local_dbb;
  allocator<char> local_dba;
  allocator<char> local_db9;
  allocator<char> local_db8;
  allocator<char> local_db7;
  allocator<char> local_db6;
  allocator<char> local_db5;
  allocator<char> local_db4;
  allocator<char> local_db3;
  allocator<char> local_db2;
  allocator<char> local_db1;
  allocator<char> local_db0;
  allocator<char> local_daf;
  allocator<char> local_dae;
  allocator<char> local_dad;
  allocator<char> local_dac;
  allocator<char> local_dab;
  allocator<char> local_daa;
  allocator<char> local_da9;
  allocator<char> local_da8;
  allocator<char> local_da7;
  allocator<char> local_da6;
  allocator<char> local_da5;
  allocator<char> local_da4;
  allocator<char> local_da3;
  allocator<char> local_da2;
  allocator<char> local_da1;
  allocator<char> local_da0;
  allocator<char> local_d9f;
  allocator<char> local_d9e;
  allocator<char> local_d9d;
  allocator<char> local_d9c;
  allocator<char> local_d9b;
  allocator<char> local_d9a;
  allocator<char> local_d99;
  allocator<char> local_d98;
  allocator<char> local_d97;
  allocator<char> local_d96;
  allocator<char> local_d95;
  allocator<char> local_d94;
  allocator<char> local_d93;
  allocator<char> local_d92;
  allocator<char> local_d91;
  allocator<char> local_d90;
  allocator<char> local_d8f;
  allocator<char> local_d8e;
  allocator<char> local_d8d;
  allocator<char> local_d8c;
  allocator<char> local_d8b;
  allocator<char> local_d8a;
  allocator<char> local_d89;
  allocator<char> local_d88;
  allocator<char> local_d87;
  allocator<char> local_d86;
  allocator<char> local_d85;
  allocator<char> local_d84;
  allocator<char> local_d83;
  allocator<char> local_d82;
  allocator<char> local_d81;
  allocator<char> local_d80;
  allocator<char> local_d7f;
  allocator<char> local_d7e;
  allocator<char> local_d7d;
  allocator<char> local_d7c;
  allocator<char> local_d7b;
  allocator<char> local_d7a;
  allocator<char> local_d79;
  SwiftGenerator *local_d78;
  CodeWriter *local_d70;
  string local_d68;
  string local_d48;
  string local_d28;
  string local_d08;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ce8;
  undefined1 local_cb8 [64];
  undefined8 local_c78;
  string local_c70 [32];
  string local_c50 [32];
  string local_c30 [32];
  string local_c10 [32];
  string local_bf0 [32];
  undefined8 local_bd0;
  string local_bc8 [32];
  string local_ba8 [32];
  string local_b88 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  Config local_180;
  
  local_d78 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d28,"",(allocator<char> *)&local_b60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d48,"_",(allocator<char> *)local_cb8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d08,"swift",&local_dc9);
  pSVar1 = local_d78;
  BaseGenerator::BaseGenerator
            (&local_d78->super_BaseGenerator,parser,path,file_name,&local_d28,&local_d48,&local_d08)
  ;
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&local_d48);
  std::__cxx11::string::~string((string *)&local_d28);
  (pSVar1->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_002fb6f0;
  local_d68._M_dataplus._M_p = (pointer)&local_d68.field_2;
  local_d68._M_string_length = 0;
  local_d68.field_2._M_local_buf[0] = '\0';
  CodeWriter::CodeWriter(&pSVar1->code_,&local_d68);
  std::__cxx11::string::~string((string *)&local_d68);
  (pSVar1->keywords_)._M_h._M_buckets = &(pSVar1->keywords_)._M_h._M_single_bucket;
  (pSVar1->keywords_)._M_h._M_bucket_count = 1;
  (pSVar1->keywords_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pSVar1->keywords_)._M_h._M_element_count = 0;
  (pSVar1->keywords_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pSVar1->keywords_)._M_h._M_rehash_policy._M_next_resize = 0;
  (pSVar1->keywords_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_cb8._0_4_ = kKeep;
  local_cb8._4_4_ = kLowerCamel;
  local_cb8._8_4_ = kLowerCamel;
  local_cb8._12_4_ = kLowerCamel;
  local_cb8._16_4_ = kLowerCamel;
  local_cb8._20_4_ = kLowerCamel;
  local_cb8._24_4_ = kLowerCamel;
  local_d70 = &pSVar1->code_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_cb8 + 0x20),".",(allocator<char> *)&local_b60);
  local_c78._0_4_ = AfterConvertingCase;
  local_c78._4_4_ = kKeep;
  std::__cxx11::string::string<std::allocator<char>>(local_c70,"_",&local_dc9);
  std::__cxx11::string::string<std::allocator<char>>(local_c50,"",&local_dc2);
  std::__cxx11::string::string<std::allocator<char>>(local_c30,"T",&local_dc3);
  std::__cxx11::string::string<std::allocator<char>>(local_c10,"",&local_dc4);
  std::__cxx11::string::string<std::allocator<char>>(local_bf0,"_",&local_dc5);
  local_bd0._0_4_ = kKeep;
  local_bd0._4_4_ = kKeep;
  std::__cxx11::string::string<std::allocator<char>>(local_bc8,"",&local_dc6);
  std::__cxx11::string::string<std::allocator<char>>(local_ba8,"_generated",&local_dc7);
  std::__cxx11::string::string<std::allocator<char>>(local_b88,".swift",&local_dc8);
  WithFlagOptions(&local_180,(Config *)local_cb8,&parser->opts,path);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b60,"associatedtype",&local_dc9);
  std::__cxx11::string::string<std::allocator<char>>(local_b40,"class",&local_dc2);
  std::__cxx11::string::string<std::allocator<char>>(local_b20,"deinit",&local_dc3);
  std::__cxx11::string::string<std::allocator<char>>(local_b00,"enum",&local_dc4);
  std::__cxx11::string::string<std::allocator<char>>(local_ae0,"extension",&local_dc5);
  std::__cxx11::string::string<std::allocator<char>>(local_ac0,"fileprivate",&local_dc6);
  std::__cxx11::string::string<std::allocator<char>>(local_aa0,"func",&local_dc7);
  std::__cxx11::string::string<std::allocator<char>>(local_a80,"import",&local_dc8);
  std::__cxx11::string::string<std::allocator<char>>(local_a60,"init",&local_d79);
  std::__cxx11::string::string<std::allocator<char>>(local_a40,"inout",&local_d7a);
  std::__cxx11::string::string<std::allocator<char>>(local_a20,"internal",&local_d7b);
  std::__cxx11::string::string<std::allocator<char>>(local_a00,"let",&local_d7c);
  std::__cxx11::string::string<std::allocator<char>>(local_9e0,"open",&local_d7d);
  std::__cxx11::string::string<std::allocator<char>>(local_9c0,"operator",&local_d7e);
  std::__cxx11::string::string<std::allocator<char>>(local_9a0,"private",&local_d7f);
  std::__cxx11::string::string<std::allocator<char>>(local_980,"protocol",&local_d80);
  std::__cxx11::string::string<std::allocator<char>>(local_960,"public",&local_d81);
  std::__cxx11::string::string<std::allocator<char>>(local_940,"rethrows",&local_d82);
  std::__cxx11::string::string<std::allocator<char>>(local_920,"static",&local_d83);
  std::__cxx11::string::string<std::allocator<char>>(local_900,"struct",&local_d84);
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,"subscript",&local_d85);
  std::__cxx11::string::string<std::allocator<char>>(local_8c0,"typealias",&local_d86);
  std::__cxx11::string::string<std::allocator<char>>(local_8a0,"var",&local_d87);
  std::__cxx11::string::string<std::allocator<char>>(local_880,"break",&local_d88);
  std::__cxx11::string::string<std::allocator<char>>(local_860,"case",&local_d89);
  std::__cxx11::string::string<std::allocator<char>>(local_840,"continue",&local_d8a);
  std::__cxx11::string::string<std::allocator<char>>(local_820,"default",&local_d8b);
  std::__cxx11::string::string<std::allocator<char>>(local_800,"defer",&local_d8c);
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"do",&local_d8d);
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"else",&local_d8e);
  std::__cxx11::string::string<std::allocator<char>>(local_7a0,"fallthrough",&local_d8f);
  std::__cxx11::string::string<std::allocator<char>>(local_780,"for",&local_d90);
  std::__cxx11::string::string<std::allocator<char>>(local_760,"guard",&local_d91);
  std::__cxx11::string::string<std::allocator<char>>(local_740,"if",&local_d92);
  std::__cxx11::string::string<std::allocator<char>>(local_720,"in",&local_d93);
  std::__cxx11::string::string<std::allocator<char>>(local_700,"repeat",&local_d94);
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"return",&local_d95);
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"switch",&local_d96);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"where",&local_d97);
  std::__cxx11::string::string<std::allocator<char>>(local_680,"while",&local_d98);
  std::__cxx11::string::string<std::allocator<char>>(local_660,"Any",&local_d99);
  std::__cxx11::string::string<std::allocator<char>>(local_640,"catch",&local_d9a);
  std::__cxx11::string::string<std::allocator<char>>(local_620,"false",&local_d9b);
  std::__cxx11::string::string<std::allocator<char>>(local_600,"is",&local_d9c);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"nil",&local_d9d);
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"super",&local_d9e);
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"self",&local_d9f);
  std::__cxx11::string::string<std::allocator<char>>(local_580,"Self",&local_da0);
  std::__cxx11::string::string<std::allocator<char>>(local_560,"throw",&local_da1);
  std::__cxx11::string::string<std::allocator<char>>(local_540,"throws",&local_da2);
  std::__cxx11::string::string<std::allocator<char>>(local_520,"true",&local_da3);
  std::__cxx11::string::string<std::allocator<char>>(local_500,"try",&local_da4);
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,"associativity",&local_da5);
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"convenience",&local_da6);
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,"dynamic",&local_da7);
  std::__cxx11::string::string<std::allocator<char>>(local_480,"didSet",&local_da8);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"final",&local_da9);
  std::__cxx11::string::string<std::allocator<char>>(local_440,"get",&local_daa);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"infix",&local_dab);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"indirect",&local_dac);
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"lazy",&local_dad);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"left",&local_dae);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"mutating",&local_daf);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"none",&local_db0);
  std::__cxx11::string::string<std::allocator<char>>(local_360,"nonmutating",&local_db1);
  std::__cxx11::string::string<std::allocator<char>>(local_340,"optional",&local_db2);
  std::__cxx11::string::string<std::allocator<char>>(local_320,"override",&local_db3);
  std::__cxx11::string::string<std::allocator<char>>(local_300,"postfix",&local_db4);
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"precedence",&local_db5);
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"prefix",&local_db6);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"Protocol",&local_db7);
  std::__cxx11::string::string<std::allocator<char>>(local_280,"required",&local_db8);
  std::__cxx11::string::string<std::allocator<char>>(local_260,"right",&local_db9);
  std::__cxx11::string::string<std::allocator<char>>(local_240,"set",&local_dba);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"Type",&local_dbb);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"unowned",&local_dbc);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"weak",&local_dbd);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"willSet",&local_dbe);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"Void",&local_dbf);
  __l._M_len = 0x4f;
  __l._M_array = &local_b60;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_ce8,__l,&local_dc0,&local_dc1);
  this_00 = &local_d78->namer_;
  lVar2 = 0x9c0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_b60._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  IdlNamer::IdlNamer(this_00,&local_180,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_ce8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_ce8);
  Namer::Config::~Config(&local_180);
  Namer::Config::~Config((Config *)local_cb8);
  pSVar1 = local_d78;
  local_d78->namespace_depth = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b60,"  ",(allocator<char> *)local_cb8);
  std::__cxx11::string::_M_assign((string *)&(pSVar1->code_).pad_);
  std::__cxx11::string::~string((string *)&local_b60);
  return;
}

Assistant:

SwiftGenerator(const Parser &parser, const std::string &path,
                 const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", "_", "swift"),
        namer_(WithFlagOptions(SwiftDefaultConfig(), parser.opts, path),
               SwiftKeywords()) {
    namespace_depth = 0;
    code_.SetPadding("  ");
  }